

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_oram.h
# Opt level: O0

void __thiscall TreeOram::~TreeOram(TreeOram *this)

{
  bool bVar1;
  iterator this_00;
  reference ppBVar2;
  __normal_iterator<Bucket<int>_**,_std::vector<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>_>
  *in_RDI;
  Bucket<int> **v;
  iterator __end1;
  iterator __begin1;
  vector<Bucket<int>_*,_std::allocator<Bucket<int>_*>_> *__range1;
  Bucket<int> *in_stack_ffffffffffffffc8;
  __normal_iterator<Bucket<int>_**,_std::vector<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>_>
  local_18 [3];
  
  local_18[0]._M_current =
       (Bucket<int> **)
       std::vector<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>::begin
                 ((vector<Bucket<int>_*,_std::allocator<Bucket<int>_*>_> *)in_stack_ffffffffffffffc8
                 );
  this_00 = std::vector<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>::end
                      ((vector<Bucket<int>_*,_std::allocator<Bucket<int>_*>_> *)
                       in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<Bucket<int>_**,_std::vector<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>_>
                               *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    ppBVar2 = __gnu_cxx::
              __normal_iterator<Bucket<int>_**,_std::vector<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>_>
              ::operator*(local_18);
    in_stack_ffffffffffffffc8 = *ppBVar2;
    if (in_stack_ffffffffffffffc8 != (Bucket<int> *)0x0) {
      Bucket<int>::~Bucket((Bucket<int> *)0x10cfc5);
      operator_delete(in_stack_ffffffffffffffc8);
    }
    __gnu_cxx::
    __normal_iterator<Bucket<int>_**,_std::vector<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>_>::
    operator++(local_18);
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)this_00._M_current);
  std::vector<Bucket<int>_*,_std::allocator<Bucket<int>_*>_>::~vector
            ((vector<Bucket<int>_*,_std::allocator<Bucket<int>_*>_> *)this_00._M_current);
  return;
}

Assistant:

~TreeOram() {
         for(auto & v : tree) 
            delete v;
      }